

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O2

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  byte bVar1;
  byte *pbVar2;
  FT_Memory pFVar3;
  FT_Byte *pFVar4;
  ulong uVar5;
  FT_Byte *new_count;
  FT_Byte *pFVar6;
  FT_ULong *pFVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  FT_Error error;
  uint local_68;
  uint local_64;
  FT_Byte *local_60;
  FT_Memory local_58;
  FT_Byte *local_50;
  ulong local_48;
  byte *local_40;
  FT_ULong real_size;
  
  pbVar2 = (loader->parser).root.limit;
  pFVar3 = (loader->parser).root.memory;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar13 = (loader->parser).root.cursor;
  local_58 = pFVar3;
  if ((pbVar13 < pbVar2) && ((loader->parser).root.cursor = pbVar13 + 1, *pbVar13 == 0x5b)) {
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    local_50 = (FT_Byte *)0x0;
    uVar14 = 0;
    iVar11 = 0;
    lVar10 = 0;
    local_64 = 0;
    uVar5 = 0;
    pFVar6 = (FT_Byte *)0x0;
    local_40 = pbVar2;
    while (pbVar13 = local_40, pbVar2 = (loader->parser).root.cursor, pbVar2 < local_40) {
      bVar1 = *pbVar2;
      if (bVar1 == 0x3c) {
        local_68 = (uint)uVar14;
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) {
          uVar14 = (ulong)local_68;
          goto LAB_001756ba;
        }
        pFVar4 = (loader->parser).root.cursor;
        new_count = (FT_Byte *)((long)(pFVar4 + ~(ulong)pbVar2) / 2);
        if ((ulong)((long)pFVar4 - (long)pbVar2) < 3) {
LAB_001756a7:
          error = 3;
        }
        else {
          pFVar6 = (FT_Byte *)
                   ft_mem_realloc(local_58,1,(FT_Long)local_50,(FT_Long)new_count,pFVar6,&error);
          if (error == 0) {
            (loader->parser).root.cursor = pbVar2;
            pFVar7 = &real_size;
            local_60 = new_count;
            (*(loader->parser).root.funcs.to_bytes)
                      ((PS_Parser)loader,pFVar6,(FT_Offset)new_count,pFVar7,'\x01');
            uVar14 = CONCAT71((int7)((ulong)pFVar7 >> 8),1);
            uVar5 = real_size;
            goto LAB_001754dc;
          }
        }
LAB_001756b2:
        uVar14 = (ulong)local_68;
        goto LAB_001756b6;
      }
      if (bVar1 == 0x5d) {
        (loader->parser).root.cursor = pbVar2 + 1;
        goto LAB_001756ba;
      }
      if (bVar1 - 0x30 < 10) {
        if ((char)uVar14 != '\0') break;
        uVar5 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
        if ((long)uVar5 < 0) {
          error = 3;
          uVar14 = 0;
          goto LAB_001756b6;
        }
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        if ((loader->parser).root.error != 0) {
          return;
        }
        pFVar4 = (loader->parser).root.cursor;
        pFVar6 = pFVar4 + 1;
        if ((ulong)((long)pbVar13 - (long)pFVar4) <= uVar5) goto LAB_001756a3;
        (loader->parser).root.cursor = pFVar4 + uVar5 + 1;
        uVar14 = 0;
      }
      else {
        local_60 = local_50;
LAB_001754dc:
        if (pFVar6 == (FT_Byte *)0x0) {
          error = 3;
          pFVar6 = (FT_Byte *)0x0;
          goto LAB_001756b6;
        }
        local_50 = local_60;
        pbVar13 = local_40;
      }
      if ((uVar5 & 1) == 0) {
LAB_001754ff:
        if (uVar5 == 0) break;
      }
      else if (pFVar6[uVar5 - 1] == '\0') {
        uVar5 = uVar5 - 1;
        goto LAB_001754ff;
      }
      local_68 = (uint)uVar14;
      uVar14 = (long)pbVar13 - (long)(loader->parser).root.cursor;
      local_60 = pFVar6;
      local_48 = uVar5;
      for (uVar15 = 0; uVar15 != uVar5; uVar15 = uVar15 + 1) {
        if (iVar11 == 2) {
LAB_0017564f:
          iVar11 = 2;
          if (face->ttf_size <= lVar10) goto LAB_001756a7;
        }
        else if (iVar11 == 1) {
LAB_001755a4:
          lVar8 = face->ttf_size;
          if (lVar8 <= lVar10) {
            uVar5 = 0;
            if (0 < (int)local_64) {
              uVar5 = (ulong)local_64;
            }
            for (lVar9 = 0; uVar5 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
              uVar12 = *(uint *)(face->ttf_data + lVar9 + 0x18);
              uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
              if ((uVar14 < uVar12) || ((long)(uVar14 - uVar12) < lVar8)) goto LAB_001756a7;
              lVar8 = lVar8 + (ulong)(uVar12 + 3 & 0xfffffffc);
              face->ttf_size = lVar8;
            }
            pFVar6 = (FT_Byte *)
                     ft_mem_realloc(local_58,1,(ulong)(local_64 << 4 | 0xc),lVar8 + 1,face->ttf_data
                                    ,&error);
            face->ttf_data = pFVar6;
            uVar5 = local_48;
            pFVar6 = local_60;
            if (error == 0) goto LAB_0017564f;
            goto LAB_001756b2;
          }
          iVar11 = 1;
        }
        else {
          iVar11 = 0;
          if (0xb < lVar10) {
            pFVar4 = face->ttf_data;
            local_64 = (uint)pFVar4[5] + (uint)pFVar4[4] * 0x10;
            uVar5 = (ulong)(local_64 * 0x10 | 0xc);
            face->ttf_size = uVar5;
            if ((long)uVar5 <= (long)uVar14) {
              pFVar6 = (FT_Byte *)ft_mem_realloc(local_58,1,0xc,uVar5,pFVar4,&error);
              face->ttf_data = pFVar6;
              uVar5 = local_48;
              pFVar6 = local_60;
              if (error == 0) goto LAB_001755a4;
              goto LAB_001756b2;
            }
            goto LAB_001756a7;
          }
        }
        face->ttf_data[lVar10] = pFVar6[uVar15];
        lVar10 = lVar10 + 1;
      }
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      uVar14 = (ulong)local_68;
      uVar5 = local_48;
      pFVar6 = local_60;
    }
    error = 3;
  }
  else {
    pFVar6 = (FT_Byte *)0x0;
LAB_001756a3:
    error = 3;
    uVar14 = 0;
  }
LAB_001756b6:
  (loader->parser).root.error = error;
LAB_001756ba:
  if ((char)uVar14 != '\0') {
    ft_mem_free(local_58,pFVar6);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     count;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;


    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    count           = 0;

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_REALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( count < 12 )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            num_tables     = 16 * face->ttf_data[4] + face->ttf_data[5];
            status         = BEFORE_TABLE_DIR;
            face->ttf_size = 12 + 16 * num_tables;

            if ( (FT_Long)size < face->ttf_size )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_REALLOC( face->ttf_data, 12, face->ttf_size ) )
              goto Fail;
          }
          /* fall through */

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( count < face->ttf_size )
          {
            face->ttf_data[count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;


            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              if ( len > size                               ||
                   face->ttf_size > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              face->ttf_size += (FT_Long)( ( len + 3 ) & ~3U );
            }

            status = OTHER_TABLES;

            if ( FT_REALLOC( face->ttf_data, 12 + 16 * num_tables,
                             face->ttf_size + 1 ) )
              goto Fail;
          }
          /* fall through */

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( count >= face->ttf_size )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( allocated )
      FT_FREE( string_buf );
  }